

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Element * __thiscall
wasm::analysis::Vector<wasm::RandomFullLattice>::getBottom
          (Element *__return_storage_ptr__,Vector<wasm::RandomFullLattice> *this)

{
  size_type __n;
  allocator<wasm::RandomElement<wasm::RandomFullLattice>_> local_29;
  RandomFullLattice local_28;
  Vector<wasm::RandomFullLattice> *local_18;
  Vector<wasm::RandomFullLattice> *this_local;
  
  __n = this->size;
  local_18 = this;
  this_local = (Vector<wasm::RandomFullLattice> *)__return_storage_ptr__;
  RandomFullLattice::getBottom(&local_28);
  std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>::allocator(&local_29);
  std::
  vector<wasm::RandomElement<wasm::RandomFullLattice>,_std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>_>
  ::vector(__return_storage_ptr__,__n,(value_type *)&local_28,&local_29);
  std::allocator<wasm::RandomElement<wasm::RandomFullLattice>_>::~allocator(&local_29);
  RandomElement<wasm::RandomFullLattice>::~RandomElement
            ((RandomElement<wasm::RandomFullLattice> *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

Element getBottom() const noexcept {
    return Element(size, lattice.getBottom());
  }